

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O1

void __thiscall
Logger<(Log)0>::createMessage<std::__cxx11::string&>
          (Logger<(Log)0> *this,stringstream *msg,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  undefined8 in_RAX;
  char *pcVar1;
  char cVar2;
  undefined8 uStack_38;
  
  cVar2 = *fmt;
  uStack_38 = in_RAX;
  if (cVar2 != '%') {
    do {
      if (cVar2 == '\0') {
        return;
      }
      if (cVar2 == '\\') break;
      uStack_38._0_7_ = CONCAT16(cVar2,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(msg + 0x10),(char *)((long)&uStack_38 + 6),1);
      fmt = fmt + 1;
      cVar2 = *fmt;
    } while (cVar2 != '%');
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(msg + 0x10),(arg->_M_dataplus)._M_p,arg->_M_string_length);
  cVar2 = fmt[1];
  if (cVar2 != '\0') {
    pcVar1 = fmt + 2;
    do {
      uStack_38 = CONCAT17(cVar2,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(msg + 0x10),(char *)((long)&uStack_38 + 7),1);
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void createMessage(std::stringstream& msg, const char* fmt, Arg1&& arg)
     {
       bool doSkipNext = false;
       while (*fmt != '%' && !doSkipNext)
       {
         doSkipNext = false;
         if (*fmt == '\0') // End of string
           return;
         
         if (*fmt == '\\')
         { //Escape for the %sign
           doSkipNext = true;
         }
         else 
         { //invoke the replacement
           msg << *fmt;
           fmt++;
         }
       }
       fmt++; //Consume the % sign
       msg << arg;
       while (*fmt != '\0')
       { //And print the end of the message!
         msg << *fmt;
         fmt++;
       }
     }